

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltools.hh
# Opt level: O3

int anon_unknown.dwarf_18458::getAttribute<int>(xmlNodePtr type,char *att_name)

{
  int iVar1;
  bool bVar2;
  char *in_RCX;
  int local_44;
  undefined **local_40;
  type_info_t *local_38;
  type_info_t *local_30;
  string local_28;
  
  (anonymous_namespace)::getStringAttribute_abi_cxx11_
            (&local_28,(_anonymous_namespace_ *)type,(xmlNodePtr)att_name,in_RCX);
  local_44 = 0;
  local_38 = (type_info_t *)(local_28._M_dataplus._M_p + local_28._M_string_length);
  local_40 = (undefined **)local_28._M_dataplus._M_p;
  bVar2 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::shr_signed<int>
                    ((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)&local_40,
                     &local_44);
  iVar1 = local_44;
  if (bVar2) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p);
    }
    return iVar1;
  }
  local_40 = &PTR__bad_cast_00113a90;
  local_38 = (type_info_t *)&std::__cxx11::string::typeinfo;
  local_30 = (type_info_t *)&int::typeinfo;
  boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_40);
}

Assistant:

T getAttribute(xmlNodePtr type, char const* att_name)
    { return boost::lexical_cast<T>(getStringAttribute(type, att_name)); }